

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall TimerNode::clearReq(TimerNode *this)

{
  std::__shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->SPHttpData).super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>);
  this->deleted_ = true;
  return;
}

Assistant:

void TimerNode::clearReq() {
  SPHttpData.reset();
  this->setDeleted();
}